

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int sock;
  int in_ESI;
  nn_thread thread;
  nn_thread nStack_18;
  
  iVar1 = test_socket_impl((char *)0x38,in_ESI,in_EDX,in_ECX);
  test_close_impl((char *)0x39,iVar1,sock);
  nn_thread_init(&nStack_18,worker,(void *)0x0);
  nn_sleep(100);
  nn_term();
  iVar1 = nn_socket(1,0x10);
  if (iVar1 == -1) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      nn_thread_term(&nStack_18);
      return 0;
    }
  }
  else {
    main_cold_1();
  }
  main_cold_2();
}

Assistant:

int main ()
{
    int rc;
    int s;
    struct nn_thread thread;

    /*  Close the socket with no associated endpoints. */
    s = test_socket (AF_SP, NN_PAIR);
    test_close (s);

    /*  Test nn_term() before nn_close(). */
    nn_thread_init (&thread, worker, NULL);
    nn_sleep (100);
    nn_term ();

    /*  Check that it's not possible to create new sockets after nn_term(). */
    rc = nn_socket (AF_SP, NN_PAIR);
    nn_assert (rc == -1);
    errno_assert (nn_errno () == ETERM);

    /*  Wait till worker thread terminates. */
    nn_thread_term (&thread);

    return 0;
}